

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::limitCheck
          (TParseContext *this,TSourceLoc *loc,int value,char *limit,char *feature)

{
  TSymbolTable *this_00;
  char *pcVar1;
  TSourceLoc *pTVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  TSymbol *pTVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TConstUnionArray *this_01;
  TConstUnion *pTVar7;
  TConstUnionArray *constArray;
  TString local_60;
  TSymbol *local_38;
  TSymbol *symbol;
  char *feature_local;
  char *limit_local;
  TSourceLoc *pTStack_18;
  int value_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  this_00 = (this->super_TParseContextBase).symbolTable;
  symbol = (TSymbol *)feature;
  feature_local = limit;
  limit_local._4_4_ = value;
  pTStack_18 = loc;
  loc_local = (TSourceLoc *)this;
  pool_allocator<char>::pool_allocator((pool_allocator<char> *)&constArray);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_60,
             limit,(pool_allocator<char> *)&constArray);
  pTVar6 = TSymbolTable::find(this_00,&local_60,(bool *)0x0,(bool *)0x0,(int *)0x0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_60);
  local_38 = pTVar6;
  iVar4 = (*pTVar6->_vptr_TSymbol[9])();
  if (CONCAT44(extraout_var,iVar4) == 0) {
    __assert_fail("symbol->getAsVariable()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                  ,0x1704,
                  "void glslang::TParseContext::limitCheck(const TSourceLoc &, int, const char *, const char *)"
                 );
  }
  iVar4 = (*local_38->_vptr_TSymbol[9])();
  this_01 = (TConstUnionArray *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0xb8))();
  bVar3 = TConstUnionArray::empty(this_01);
  iVar4 = limit_local._4_4_;
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    __assert_fail("! constArray.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                  ,0x1706,
                  "void glslang::TParseContext::limitCheck(const TSourceLoc &, int, const char *, const char *)"
                 );
  }
  pTVar7 = TConstUnionArray::operator[](this_01,0);
  iVar5 = TConstUnion::getIConst(pTVar7);
  pTVar2 = pTStack_18;
  pcVar1 = feature_local;
  pTVar6 = symbol;
  if (iVar5 < iVar4) {
    pTVar7 = TConstUnionArray::operator[](this_01,0);
    iVar4 = TConstUnion::getIConst(pTVar7);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar2,"must be less than or equal to",pTVar6,"%s (%d)",pcVar1,iVar4);
  }
  return;
}

Assistant:

void TParseContext::limitCheck(const TSourceLoc& loc, int value, const char* limit, const char* feature)
{
    TSymbol* symbol = symbolTable.find(limit);
    assert(symbol->getAsVariable());
    const TConstUnionArray& constArray = symbol->getAsVariable()->getConstArray();
    assert(! constArray.empty());
    if (value > constArray[0].getIConst())
        error(loc, "must be less than or equal to", feature, "%s (%d)", limit, constArray[0].getIConst());
}